

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_explain.cpp
# Opt level: O2

unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>,_true> __thiscall
duckdb::Transformer::TransformExplain(Transformer *this,PGExplainStmt *stmt)

{
  __uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_> _Var1;
  bool bVar2;
  PGDefElem *pPVar3;
  PGValue *pPVar4;
  pointer pCVar5;
  NotImplementedException *this_00;
  InvalidInputException *this_01;
  long in_RDX;
  undefined8 *puVar6;
  bool bVar7;
  PGValue val_00;
  ExplainFormat explain_format;
  ExplainType explain_type;
  optional_ptr<duckdb::Transformer,_true> local_e0;
  ParserOptions *local_d8;
  __uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_> local_c8
  ;
  optional_ptr<duckdb_libpgquery::PGValue,_true> local_c0;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> def_elem;
  Value val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string elem;
  
  explain_type = EXPLAIN_STANDARD;
  explain_format = DEFAULT;
  puVar6 = *(undefined8 **)(in_RDX + 0x10);
  local_d8 = (ParserOptions *)stmt;
  local_c8._M_t.
  super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
  .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl =
       (tuple<duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>)
       (tuple<duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>)this;
  if (puVar6 != (undefined8 *)0x0) {
    bVar7 = false;
    while (puVar6 = (undefined8 *)puVar6[1], puVar6 != (undefined8 *)0x0) {
      def_elem.ptr = (PGDefElem *)*puVar6;
      pPVar3 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
      ::std::__cxx11::string::string((string *)&val,pPVar3->defname,(allocator *)&local_e0);
      StringUtil::Lower(&elem,(string *)&val);
      ::std::__cxx11::string::~string((string *)&val);
      bVar2 = ::std::operator==(&elem,"analyze");
      if (bVar2) {
        explain_type = EXPLAIN_ANALYZE;
      }
      else {
        bVar2 = ::std::operator==(&elem,"format");
        if (!bVar2) {
          this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&val,"Unimplemented explain type: %s",(allocator *)&local_e0);
          ::std::__cxx11::string::string((string *)&local_70,(string *)&elem);
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this_00,(string *)&val,&local_70);
          __cxa_throw(this_00,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        pPVar3 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
        if (pPVar3->arg != (PGNode *)0x0) {
          if (bVar7) {
            this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&val,"FORMAT can not be provided more than once",
                       (allocator *)&local_e0);
            InvalidInputException::InvalidInputException(this_01,(string *)&val);
            __cxa_throw(this_01,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pPVar3 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
          local_c0.ptr = (PGValue *)pPVar3->arg;
          pPVar4 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator*(&local_c0);
          val_00.val.ival._0_4_ = pPVar4->type;
          val_00._0_8_ = local_d8;
          val_00.val.ival._4_4_ = 0;
          TransformValue((Transformer *)&local_e0,val_00);
          pCVar5 = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                                 *)&local_e0);
          Value::Value(&val,&pCVar5->value);
          if (local_e0.ptr != (Transformer *)0x0) {
            (*(code *)(((local_e0.ptr)->parent).ptr)->options)();
          }
          explain_format = ParseFormat(&val);
          Value::~Value(&val);
          bVar7 = true;
        }
      }
      ::std::__cxx11::string::~string((string *)&elem);
    }
  }
  TransformStatement((Transformer *)&val,(PGNode *)local_d8);
  _Var1._M_t.
  super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
  .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl =
       local_c8._M_t.
       super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
       .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl;
  make_uniq<duckdb::ExplainStatement,duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,duckdb::ExplainType&,duckdb::ExplainFormat&>
            ((duckdb *)
             local_c8._M_t.
             super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
             .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             &val,&explain_type,&explain_format);
  if (val.type_._0_8_ != 0) {
    (**(code **)(*(long *)val.type_._0_8_ + 8))();
  }
  return (unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>)
         (_Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
          )_Var1._M_t.
           super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
           .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ExplainStatement> Transformer::TransformExplain(duckdb_libpgquery::PGExplainStmt &stmt) {
	auto explain_type = ExplainType::EXPLAIN_STANDARD;
	auto explain_format = ExplainFormat::DEFAULT;
	bool format_is_set = false;
	if (stmt.options) {
		for (auto n = stmt.options->head; n; n = n->next) {
			auto def_elem = PGPointerCast<duckdb_libpgquery::PGDefElem>(n->data.ptr_value);
			auto def_name = def_elem->defname;
			auto elem = StringUtil::Lower(def_name);
			if (elem == "analyze") {
				explain_type = ExplainType::EXPLAIN_ANALYZE;
			} else if (elem == "format") {
				if (def_elem->arg) {
					if (format_is_set) {
						throw InvalidInputException("FORMAT can not be provided more than once");
					}
					auto val = TransformValue(*PGPointerCast<duckdb_libpgquery::PGValue>(def_elem->arg))->value;
					format_is_set = true;
					explain_format = ParseFormat(val);
				}
			} else {
				throw NotImplementedException("Unimplemented explain type: %s", elem);
			}
		}
	}
	return make_uniq<ExplainStatement>(TransformStatement(*stmt.query), explain_type, explain_format);
}